

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiID *pIVar1;
  ImGuiID *pIVar2;
  float fVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  float fVar8;
  float fVar9;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar6 = GImGui;
  pIVar5 = GImGui->MovingWindow;
  if (pIVar5 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar4 = GImGui->ActiveId;
    if (GImGui->ActiveIdWindow->MoveId != IVar4) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar4;
    if (pIVar6->ActiveIdPreviousFrame == IVar4) {
      pIVar6->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar6->IO).MouseDown[0] != false) {
      return;
    }
    ClearActiveID();
    return;
  }
  pIVar1 = &GImGui->ActiveId;
  pIVar2 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar1;
  if (*pIVar2 == *pIVar1) {
    pIVar6->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar5 = pIVar5->RootWindow;
  if (pIVar5 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0xdda,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  if (((pIVar6->IO).MouseDown[0] != true) ||
     (bVar7 = IsMousePosValid(&(pIVar6->IO).MousePos), !bVar7)) {
    ClearActiveID();
    pIVar6->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  fVar8 = (pIVar6->IO).MousePos.x - (pIVar6->ActiveIdClickOffset).x;
  fVar9 = (pIVar6->IO).MousePos.y - (pIVar6->ActiveIdClickOffset).y;
  local_18.y = fVar9;
  local_18.x = fVar8;
  fVar3 = (pIVar5->Pos).x;
  if ((fVar3 == fVar8) && (!NAN(fVar3) && !NAN(fVar8))) {
    fVar3 = (pIVar5->Pos).y;
    if ((fVar3 == fVar9) && (!NAN(fVar3) && !NAN(fVar9))) goto LAB_001e91d7;
  }
  if (((pIVar5->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  SetWindowPos(pIVar5,&local_18,1);
LAB_001e91d7:
  FocusWindow(pIVar6->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}